

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

void extend_params(dill_stream_conflict s,int argno)

{
  int iVar1;
  void *pvVar2;
  int in_ESI;
  long in_RDI;
  int i;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(*(long *)(in_RDI + 8) + 0x1a0) == 0) {
    pvVar2 = dill_malloc(CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    *(void **)(*(long *)(in_RDI + 8) + 0x1a8) = pvVar2;
    pvVar2 = dill_malloc(CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    *(void **)(*(long *)(in_RDI + 8) + 0x1b0) = pvVar2;
    pvVar2 = dill_malloc(CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    *(void **)(*(long *)(in_RDI + 8) + 0x1b8) = pvVar2;
  }
  else if (*(int *)(*(long *)(in_RDI + 8) + 0x1a0) <= in_ESI + 1) {
    pvVar2 = dill_realloc((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          in_stack_ffffffffffffffe8);
    *(void **)(*(long *)(in_RDI + 8) + 0x1a8) = pvVar2;
    pvVar2 = dill_realloc((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          in_stack_ffffffffffffffe8);
    *(void **)(*(long *)(in_RDI + 8) + 0x1b0) = pvVar2;
    pvVar2 = dill_realloc((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          in_stack_ffffffffffffffe8);
    *(void **)(*(long *)(in_RDI + 8) + 0x1b8) = pvVar2;
  }
  for (iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0x1a0); iVar1 <= in_ESI; iVar1 = iVar1 + 1) {
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1a8) + (long)iVar1 * 8) = 0;
    *(undefined1 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b0) + (long)iVar1 * 0x14) = 0xb;
    *(undefined1 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b0) + (long)iVar1 * 0x14 + 1) = 0;
    *(undefined1 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b0) + (long)iVar1 * 0x14 + 2) = 0;
    *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b0) + (long)iVar1 * 0x14 + 4) = 0;
    *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b0) + (long)iVar1 * 0x14 + 8) = 0;
    *(undefined4 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b0) + (long)iVar1 * 0x14 + 0xc) = 0;
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x1b8) + (long)iVar1 * 8) = 0;
  }
  *(int *)(*(long *)(in_RDI + 8) + 0x1a0) = in_ESI + 1;
  return;
}

Assistant:

static void
extend_params(dill_stream s, int argno)
{
    int i;
    if (s->p->c_param_count == 0) {
        s->p->c_param_regs =
            malloc(sizeof(s->p->c_param_regs[0]) * (argno + 2));
        s->p->c_param_args =
            malloc(sizeof(s->p->c_param_args[0]) * (argno + 2));
        s->p->c_param_structs =
            malloc(sizeof(s->p->c_param_structs[0]) * (argno + 2));
    } else if (s->p->c_param_count <= (argno + 1)) {
        s->p->c_param_regs = realloc(
            s->p->c_param_regs, sizeof(s->p->c_param_regs[0]) * (argno + 2));
        s->p->c_param_args = realloc(
            s->p->c_param_args, sizeof(s->p->c_param_args[0]) * (argno + 2));
        s->p->c_param_structs =
            realloc(s->p->c_param_structs,
                    sizeof(s->p->c_param_structs[0]) * (argno + 2));
    }
    for (i = s->p->c_param_count; i <= argno; i++) {
        s->p->c_param_regs[i] = NULL;
        s->p->c_param_args[i].type = DILL_V;
        s->p->c_param_args[i].is_register = 0;
        s->p->c_param_args[i].is_immediate = 0;
        s->p->c_param_args[i].in_reg = 0;
        s->p->c_param_args[i].out_reg = 0;
        s->p->c_param_args[i].offset = 0;
        s->p->c_param_structs[i] = NULL;
    }
    s->p->c_param_count = (argno + 1);
}